

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guiddatabase.cpp
# Opt level: O0

USTATUS guidDatabaseExportToFile(CBString *outPath,GuidDatabase *db)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  pointer ppVar5;
  ostream *poVar6;
  allocator local_2a1;
  string local_2a0 [8];
  string name;
  CBString local_278;
  string local_260 [8];
  string guid;
  _Self local_238;
  iterator it;
  long local_220;
  ofstream outputFile;
  GuidDatabase *db_local;
  CBString *outPath_local;
  
  pcVar4 = Bstrlib::CBString::toLocal8Bit(outPath);
  _Var3 = std::operator|(_S_out,_S_trunc);
  std::ofstream::ofstream(&local_220,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_238._M_node =
         (_Base_ptr)
         std::
         map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
         ::begin(db);
    while( true ) {
      guid.field_2._8_8_ =
           std::
           map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
           ::end(db);
      bVar2 = std::operator!=(&local_238,(_Self *)((long)&guid.field_2 + 8));
      if (!bVar2) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>::operator->
                         (&local_238);
      guidToUString(&local_278,&ppVar5->first,false);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(&local_278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,pcVar4,(allocator *)(name.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      Bstrlib::CBString::~CBString(&local_278);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>::operator->
                         (&local_238);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(&ppVar5->second);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,pcVar4,&local_2a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      poVar6 = std::operator<<((ostream *)&local_220,local_260);
      poVar6 = std::operator<<(poVar6,',');
      poVar6 = std::operator<<(poVar6,local_2a0);
      std::operator<<(poVar6,'\n');
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_260);
      std::_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>::operator++
                (&local_238,0);
    }
    outPath_local = (CBString *)0x0;
  }
  else {
    outPath_local = (CBString *)0x5;
  }
  it._M_node._0_4_ = 1;
  std::ofstream::~ofstream(&local_220);
  return (USTATUS)outPath_local;
}

Assistant:

USTATUS guidDatabaseExportToFile(const UString & outPath, GuidDatabase & db)
{
    std::ofstream outputFile(outPath.toLocal8Bit(), std::ios::out | std::ios::trunc);
    if (!outputFile)
        return U_FILE_OPEN;
    for (GuidDatabase::iterator it = db.begin(); it != db.end(); it++) {
        std::string guid(guidToUString (it->first, false).toLocal8Bit());
        std::string name(it->second.toLocal8Bit());
        outputFile << guid << ',' << name << '\n';
    }
    
    return U_SUCCESS;
}